

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O0

png_uint_32 get_unknown(display *d,png_infop info_ptr,int after_IDAT)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int local_2c;
  int chunk;
  int num_unknown;
  png_unknown_chunkp unknown;
  png_uint_32 flags;
  int after_IDAT_local;
  png_infop info_ptr_local;
  display *d_local;
  
  unknown._0_4_ = 0;
  unknown._4_4_ = after_IDAT;
  _flags = info_ptr;
  info_ptr_local = (png_infop)d;
  local_2c = png_get_unknown_chunks(d->png_ptr,info_ptr,&chunk);
  do {
    while( true ) {
      while( true ) {
        local_2c = local_2c + -1;
        if (local_2c < 0) {
          return (uint)unknown;
        }
        iVar2 = findb((png_byte *)(_chunk + (long)local_2c * 0x20));
        if (iVar2 < 0) break;
        unknown._0_4_ = chunk_info[iVar2].flag | (uint)unknown;
      }
      uVar1 = *(uint *)(info_ptr_local + 0xf0);
      if (uVar1 < 2) break;
      if (uVar1 == 2) {
        iVar2 = ancillaryb((png_byte *)(_chunk + (long)local_2c * 0x20));
        if (iVar2 == 0) {
          fprintf(_stderr,"%s(%s): if-safe: %s: unknown critical chunk saved\n",
                  *(undefined8 *)(info_ptr_local + 0x100),*(undefined8 *)(info_ptr_local + 0x108),
                  _chunk + (long)local_2c * 0x20);
          *(int *)(info_ptr_local + 0xe8) = *(int *)(info_ptr_local + 0xe8) + 1;
        }
      }
      else if (uVar1 != 3) break;
    }
    pcVar3 = "default";
    if (*(int *)(info_ptr_local + 0xf0) != 0) {
      pcVar3 = "discard";
    }
    fprintf(_stderr,"%s(%s): %s: %s: unknown chunk saved\n",*(undefined8 *)(info_ptr_local + 0x100),
            *(undefined8 *)(info_ptr_local + 0x108),pcVar3,_chunk + (long)local_2c * 0x20);
    *(int *)(info_ptr_local + 0xe8) = *(int *)(info_ptr_local + 0xe8) + 1;
  } while( true );
}

Assistant:

static png_uint_32
get_unknown(display *d, png_infop info_ptr, int after_IDAT)
{
   /* Create corresponding 'unknown' flags */
   png_uint_32 flags = 0;

   UNUSED(after_IDAT)

   {
      png_unknown_chunkp unknown;
      int num_unknown = png_get_unknown_chunks(d->png_ptr, info_ptr, &unknown);

      while (--num_unknown >= 0)
      {
         int chunk = findb(unknown[num_unknown].name);

         /* Chunks not known to pngunknown must be validated here; since they
          * must also be unknown to libpng the 'display->keep' behavior should
          * have been used.
          */
         if (chunk < 0) switch (d->keep)
         {
            default: /* impossible */
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
            case PNG_HANDLE_CHUNK_NEVER:
               fprintf(stderr, "%s(%s): %s: %s: unknown chunk saved\n",
                  d->file, d->test, d->keep ? "discard" : "default",
                  unknown[num_unknown].name);
               ++(d->error_count);
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (!ancillaryb(unknown[num_unknown].name))
               {
                  fprintf(stderr,
                     "%s(%s): if-safe: %s: unknown critical chunk saved\n",
                     d->file, d->test, unknown[num_unknown].name);
                  ++(d->error_count);
                  break;
               }
               /* FALLTHROUGH */ /* (safe) */
            case PNG_HANDLE_CHUNK_ALWAYS:
               break;
         }

         else
            flags |= chunk_info[chunk].flag;
      }
   }

   return flags;
}